

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O2

void __thiscall SourceMapTest::parseMap(SourceMapTest *this,string *sourceMap)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  pointer __p;
  vector<char,std::allocator<char>> local_40 [31];
  allocator_type local_21;
  
  __first._M_current = (sourceMap->_M_dataplus)._M_p;
  std::vector<char,std::allocator<char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            (local_40,__first,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + sourceMap->_M_string_length),&local_21);
  std::vector<char,_std::allocator<char>_>::_M_move_assign(&this->buffer,local_40);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)local_40);
  __p = (pointer)operator_new(0x40);
  __p->buffer = &this->buffer;
  (__p->mappings)._M_len = 0;
  (__p->mappings)._M_str = (char *)0x0;
  __p->pos = 0;
  __p->location = 0;
  __p->file = 0;
  __p->line = 1;
  __p->col = 0;
  __p->symbol = 0;
  __p->hasInfo = false;
  __p->hasSymbol = false;
  std::__uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>::reset
            ((__uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_> *)
             &this->reader,__p);
  ::wasm::SourceMapReader::parse
            ((Module *)
             (this->reader)._M_t.
             super___uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::SourceMapReader_*,_std::default_delete<wasm::SourceMapReader>_>
             .super__Head_base<0UL,_wasm::SourceMapReader_*,_false>._M_head_impl);
  return;
}

Assistant:

void parseMap(std::string& sourceMap) {
    buffer = {sourceMap.begin(), sourceMap.end()};
    reader.reset(new SourceMapReader(buffer));
    reader->parse(wasm);
  }